

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

String * Lexer::DescribeTokenPrivate(String *__return_storage_ptr__,Token tokType,TokenInfo *tok)

{
  String local_90;
  String local_60;
  String local_40;
  TokenInfo *local_20;
  TokenInfo *tok_local;
  String *pSStack_10;
  Token tokType_local;
  
  local_20 = tok;
  tok_local._4_4_ = tokType;
  pSStack_10 = __return_storage_ptr__;
  if ((int)tokType < 0x49) {
    LexerScanner::GetTokenString(&local_60,tokType);
    ::operator+(&local_40,"\"",&local_60);
    String::operator+(__return_storage_ptr__,&local_40,"\"");
    String::~String(&local_40);
    String::~String(&local_60);
  }
  else {
    switch(tokType) {
    case Symbol:
      if (tok == (TokenInfo *)0x0) {
        String::String(__return_storage_ptr__,"a symbol");
      }
      else {
        String::String(__return_storage_ptr__,&tok->text);
      }
      break;
    case Number:
      if (tok == (TokenInfo *)0x0) {
        String::String(__return_storage_ptr__,"a number");
      }
      else {
        String::String(__return_storage_ptr__,&tok->text);
      }
      break;
    case String:
      if (tok == (TokenInfo *)0x0) {
        String::String(__return_storage_ptr__,"a string");
      }
      else {
        ::operator+(&local_90,"\"",&tok->text);
        String::operator+(__return_storage_ptr__,&local_90,"\"");
        String::~String(&local_90);
      }
      break;
    case Any:
      if (tok == (TokenInfo *)0x0) {
        String::String(__return_storage_ptr__,"any token");
      }
      else {
        String::String(__return_storage_ptr__,&tok->text);
      }
      break;
    default:
      String::String(__return_storage_ptr__,"");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String Lexer::DescribeTokenPrivate (Token tokType, Lexer::TokenInfo* tok)
{
	if (tokType < LastNamedToken)
		return "\"" + LexerScanner::GetTokenString (tokType) + "\"";

	switch (tokType)
	{
		case Token::Symbol:	return tok ? tok->text : "a symbol";
		case Token::Number:	return tok ? tok->text : "a number";
		case Token::String:	return tok ? ("\"" + tok->text + "\"") : "a string";
		case Token::Any:	return tok ? tok->text : "any token";
		default: break;
	}

	return "";
}